

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O3

void fn_build_full_path(char *buf,size_t buflen,char *dir,char *fname,int literal)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  iVar3 = CVmNetFile::is_net_mode();
  if (iVar3 == 0) {
    if (literal == 0) {
      os_build_full_path(buf,buflen,dir,fname);
      return;
    }
    os_combine_paths(buf,buflen,dir,fname);
    return;
  }
  if (*fname == '/') {
    if (buflen != 0) {
      sVar4 = strlen(fname);
      uVar8 = buflen - 1;
      if (sVar4 <= buflen - 1) {
        uVar8 = sVar4;
      }
      memcpy(buf,fname,uVar8);
      buf[uVar8] = '\0';
    }
  }
  else {
    sVar4 = strlen(dir);
    if (sVar4 == 0) {
      pcVar6 = "/";
    }
    else {
      pcVar6 = "/";
      if (dir[sVar4 - 1] == '/') {
        pcVar6 = "";
      }
    }
    t3sprintf(buf,buflen,"%s%s%s",dir,pcVar6,fname);
  }
  if (literal != 0) {
    return;
  }
  cVar1 = *buf;
  sVar4 = strlen(buf);
  uVar10 = 0;
  puVar5 = (undefined8 *)operator_new__(-(ulong)(sVar4 >> 0x3d != 0) | sVar4 * 8);
  pcVar6 = strtok(buf,"/");
  *puVar5 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    uVar8 = 0;
    do {
      pcVar6 = strtok((char *)0x0,"/");
      puVar5[uVar8 + 1] = pcVar6;
      uVar8 = uVar8 + 1;
    } while (pcVar6 != (char *)0x0);
    uVar7 = 0;
    uVar10 = 0;
    do {
      pcVar6 = (char *)puVar5[uVar7];
      if (*pcVar6 != '\0') {
        if (*pcVar6 == '.') {
          if (pcVar6[1] != '\0') {
            if ((((pcVar6[1] != '.') || (pcVar6[2] != '\0')) || ((int)uVar10 < 1)) ||
               (((pcVar2 = (char *)puVar5[(ulong)uVar10 - 1], *pcVar2 == '.' && (pcVar2[1] == '.'))
                && (pcVar2[2] == '\0')))) goto LAB_0024f335;
            uVar10 = uVar10 - 1;
          }
        }
        else {
LAB_0024f335:
          lVar9 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          puVar5[lVar9] = pcVar6;
        }
      }
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0xffffffff) != uVar7);
  }
  pcVar6 = buf;
  if (cVar1 == '/') {
    pcVar6 = buf + 1;
    *buf = '/';
  }
  if (0 < (int)uVar10) {
    uVar8 = 1;
    do {
      pcVar2 = (char *)puVar5[uVar8 - 1];
      sVar4 = strlen(pcVar2);
      memcpy(pcVar6,pcVar2,sVar4);
      pcVar6 = pcVar6 + sVar4;
      if (uVar8 < uVar10) {
        *pcVar6 = '/';
        pcVar6 = pcVar6 + 1;
      }
      bVar11 = uVar8 != uVar10;
      uVar8 = uVar8 + 1;
    } while (bVar11);
  }
  *pcVar6 = '\0';
  if (*buf == '\0') {
    buf[0] = '.';
    buf[1] = '\0';
  }
  operator_delete__(puVar5);
  return;
}

Assistant:

static void fn_build_full_path(
    VMG_ char *buf, size_t buflen,
    const char *dir, const char *fname, int literal)
{
    if (CVmNetFile::is_net_mode(vmg0_))
    {
        /* 
         *   Network storage mode - use Unix rules.  First, if the filename
         *   is in absolute format already, use it unchanged.  If not, append
         *   the filename to the directory, adding a '/' between the two if
         *   the directory doesn't already end with a slash.
         */
        if (fname[0] == '/')
        {
            /* the file is absolute - return it unchanged */
            lib_strcpy(buf, buflen, fname);
        }
        else
        {
            /* note the last character of the directory path */
            size_t dirlen = strlen(dir);
            char dirlast = dirlen != 0 ? dir[dirlen-1] : 0;

            /* build the result */
            t3sprintf(buf, buflen, "%s%s%s",
                      dir, dirlast == '/' ? "" : "/", fname);
        }

        /* if not in literal mode, canonicalize the result */
        if (!literal)
            nf_canonicalize(buf);
    }
    else
    {
        /* local storage mode - use local OS rules */
        if (literal)
            os_combine_paths(buf, buflen, dir, fname);
        else
            os_build_full_path(buf, buflen, dir, fname);
    }
}